

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringCacheTest.cpp
# Opt level: O3

Utest * __thiscall
TEST_SimpleStringInternalCache_allocationWillReuseTheAllocatedBlocks_TestShell::createTest
          (TEST_SimpleStringInternalCache_allocationWillReuseTheAllocatedBlocks_TestShell *this)

{
  TEST_SimpleStringInternalCache_allocationWillReuseTheAllocatedBlocks_Test *this_00;
  
  this_00 = (TEST_SimpleStringInternalCache_allocationWillReuseTheAllocatedBlocks_Test *)
            operator_new(0xa0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringCacheTest.cpp"
                         ,0x85);
  TEST_SimpleStringInternalCache_allocationWillReuseTheAllocatedBlocks_Test::
  TEST_SimpleStringInternalCache_allocationWillReuseTheAllocatedBlocks_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(SimpleStringInternalCache, allocationWillReuseTheAllocatedBlocks)
{
    cache.setAllocator(allocator);

    char* mem = cache.alloc(10);
    cache.dealloc(mem, 10);
    mem = cache.alloc(10);
    cache.dealloc(mem, 10);

    LONGS_EQUAL(1, accountant.totalAllocationsOfSize(32));
}